

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_arg.cc
# Opt level: O0

void __thiscall BuiltinFuncArg::PrintCDef(BuiltinFuncArg *this,FILE *fp,int n)

{
  uint in_EDX;
  FILE *in_RSI;
  undefined8 *in_RDI;
  char buf [1024];
  char local_418 [1028];
  uint local_14;
  FILE *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  fprintf(in_RSI,"\t%s %s = (%s) (",builtin_func_arg_type[*(int *)(in_RDI + 1)].c_type,*in_RDI,
          builtin_func_arg_type[*(int *)(in_RDI + 1)].c_type);
  snprintf(local_418,0x400,"(*%s)[%d].get()",arg_list_name,(ulong)local_14);
  fprintf(local_10,builtin_func_arg_type[*(int *)(in_RDI + 1)].accessor,local_418);
  fprintf(local_10,");\n");
  return;
}

Assistant:

void BuiltinFuncArg::PrintCDef(FILE* fp, int n)
	{
	fprintf(fp, "\t%s %s = (%s) (", builtin_func_arg_type[type].c_type, name,
	        builtin_func_arg_type[type].c_type);

	char buf[1024];
	snprintf(buf, sizeof(buf), "(*%s)[%d].get()", arg_list_name, n);
	// Print the accessor expression.
	fprintf(fp, builtin_func_arg_type[type].accessor, buf);

	fprintf(fp, ");\n");
	}